

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMaj.c
# Opt level: O1

int Gem_GroupsDerive(word *pTruth,int nVars,word *pCof0,word *pCof1)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  byte bVar6;
  int iVar7;
  word *pwVar8;
  word *pwVar9;
  ulong uVar10;
  word *pwVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  word *pLimit;
  bool bVar16;
  bool bVar17;
  word *pLimit_2;
  word *pLimit_1;
  
  uVar3 = 1 << ((byte)(nVars - 1U) & 0x1f);
  if (1 < nVars) {
    uVar1 = 1 << ((char)nVars - 6U & 0x1f);
    if (nVars < 7) {
      uVar1 = 1;
    }
    uVar14 = (ulong)uVar1;
    uVar10 = 0;
    do {
      bVar2 = (byte)uVar10;
      if (uVar1 == 1) {
        *pCof0 = (s_Truths6Neg[uVar10] & *pTruth) << ((byte)(1 << (bVar2 & 0x1f)) & 0x3f) |
                 s_Truths6Neg[uVar10] & *pTruth;
      }
      else if (uVar10 < 6) {
        if (0 < (int)uVar1) {
          uVar15 = s_Truths6Neg[uVar10];
          uVar13 = 0;
          do {
            pCof0[uVar13] =
                 (pTruth[uVar13] & uVar15) << ((byte)(1 << (bVar2 & 0x1f)) & 0x3f) |
                 pTruth[uVar13] & uVar15;
            uVar13 = uVar13 + 1;
          } while (uVar14 != uVar13);
        }
      }
      else if (0 < (int)uVar1) {
        bVar6 = (byte)(uVar10 - 6);
        uVar4 = 1 << (bVar6 & 0x1f);
        iVar7 = 2 << (bVar6 & 0x1f);
        uVar15 = 1;
        if (1 < (int)uVar4) {
          uVar15 = (ulong)uVar4;
        }
        pwVar9 = pCof0 + (int)uVar4;
        pwVar8 = pCof0;
        pwVar11 = pTruth;
        do {
          if (uVar10 - 6 != 0x1f) {
            uVar13 = 0;
            do {
              pwVar8[uVar13] = pwVar11[uVar13];
              pwVar9[uVar13] = pwVar11[uVar13];
              uVar13 = uVar13 + 1;
            } while (uVar15 != uVar13);
          }
          pwVar11 = pwVar11 + iVar7;
          pwVar9 = pwVar9 + iVar7;
          pwVar8 = pwVar8 + iVar7;
        } while (pwVar11 < pTruth + (int)uVar1);
      }
      if (uVar1 == 1) {
        *pCof1 = (s_Truths6[uVar10] & *pTruth) >> ((byte)(1 << (bVar2 & 0x1f)) & 0x3f) |
                 s_Truths6[uVar10] & *pTruth;
      }
      else if (uVar10 < 6) {
        if (0 < (int)uVar1) {
          uVar15 = s_Truths6[uVar10];
          uVar13 = 0;
          do {
            pCof1[uVar13] =
                 (pTruth[uVar13] & uVar15) >> ((byte)(1 << (bVar2 & 0x1f)) & 0x3f) |
                 pTruth[uVar13] & uVar15;
            uVar13 = uVar13 + 1;
          } while (uVar14 != uVar13);
        }
      }
      else if (0 < (int)uVar1) {
        bVar6 = (byte)(uVar10 - 6);
        uVar4 = 1 << (bVar6 & 0x1f);
        iVar7 = 2 << (bVar6 & 0x1f);
        uVar15 = 1;
        pwVar9 = pTruth;
        pwVar8 = pCof1;
        if (1 < (int)uVar4) {
          uVar15 = (ulong)uVar4;
        }
        do {
          if (uVar10 - 6 != 0x1f) {
            uVar13 = 0;
            do {
              pwVar8[uVar13] = pwVar9[(long)(int)uVar4 + uVar13];
              pwVar8[(long)(int)uVar4 + uVar13] = pwVar9[(long)(int)uVar4 + uVar13];
              uVar13 = uVar13 + 1;
            } while (uVar15 != uVar13);
          }
          pwVar9 = pwVar9 + iVar7;
          pwVar8 = pwVar8 + iVar7;
        } while (pwVar9 < pTruth + (int)uVar1);
      }
      uVar15 = uVar10 + 1;
      if (uVar1 == 1) {
        *pCof0 = (s_Truths6[uVar15] & *pCof0) >> ((byte)(2 << (bVar2 & 0x1f)) & 0x3f) |
                 s_Truths6[uVar15] & *pCof0;
      }
      else if (uVar10 < 5) {
        if (0 < (int)uVar1) {
          uVar13 = s_Truths6[uVar15];
          uVar5 = 0;
          do {
            pCof0[uVar5] = (pCof0[uVar5] & uVar13) >> ((byte)(2 << (bVar2 & 0x1f)) & 0x3f) |
                           pCof0[uVar5] & uVar13;
            uVar5 = uVar5 + 1;
          } while (uVar14 != uVar5);
        }
      }
      else if (0 < (int)uVar1) {
        bVar6 = (byte)(uVar10 - 5);
        uVar4 = 1 << (bVar6 & 0x1f);
        uVar13 = 1;
        if (1 < (int)uVar4) {
          uVar13 = (ulong)uVar4;
        }
        pwVar9 = pCof0;
        do {
          if (uVar10 - 5 != 0x1f) {
            uVar5 = 0;
            do {
              pwVar9[uVar5] = pwVar9[(long)(int)uVar4 + uVar5];
              uVar5 = uVar5 + 1;
            } while (uVar13 != uVar5);
          }
          pwVar9 = pwVar9 + (2 << (bVar6 & 0x1f));
        } while (pwVar9 < pCof0 + (int)uVar1);
      }
      if (uVar1 == 1) {
        *pCof1 = (s_Truths6Neg[uVar15] & *pCof1) << ((byte)(2 << (bVar2 & 0x1f)) & 0x3f) |
                 s_Truths6Neg[uVar15] & *pCof1;
      }
      else if (uVar10 < 5) {
        if (0 < (int)uVar1) {
          uVar10 = s_Truths6Neg[uVar15];
          uVar13 = 0;
          do {
            pCof1[uVar13] =
                 (pCof1[uVar13] & uVar10) << ((byte)(2 << (bVar2 & 0x1f)) & 0x3f) |
                 pCof1[uVar13] & uVar10;
            uVar13 = uVar13 + 1;
          } while (uVar14 != uVar13);
        }
      }
      else if (0 < (int)uVar1) {
        bVar6 = (byte)(uVar10 - 5);
        uVar4 = 1 << (bVar6 & 0x1f);
        iVar7 = 2 << (bVar6 & 0x1f);
        uVar13 = 1;
        if (1 < (int)uVar4) {
          uVar13 = (ulong)uVar4;
        }
        pwVar9 = pCof1 + (int)uVar4;
        pwVar8 = pCof1;
        do {
          if (uVar10 - 5 != 0x1f) {
            uVar5 = 0;
            do {
              pwVar9[uVar5] = pwVar8[uVar5];
              uVar5 = uVar5 + 1;
            } while (uVar13 != uVar5);
          }
          pwVar8 = pwVar8 + iVar7;
          pwVar9 = pwVar9 + iVar7;
        } while (pwVar8 < pCof1 + (int)uVar1);
      }
      if ((int)uVar1 < 1) {
        bVar16 = false;
      }
      else {
        lVar12 = 0;
        do {
          bVar16 = pCof0[lVar12] != pCof1[lVar12];
          if (bVar16) break;
          bVar17 = uVar14 - 1 != lVar12;
          lVar12 = lVar12 + 1;
        } while (bVar17);
      }
      uVar4 = 1 << (bVar2 & 0x1f);
      if (!bVar16) {
        uVar4 = 0;
      }
      uVar3 = uVar3 | uVar4;
      uVar10 = uVar15;
    } while (uVar15 != nVars - 1U);
  }
  return uVar3;
}

Assistant:

int Gem_GroupsDerive( word * pTruth, int nVars, word * pCof0, word * pCof1 )
{
    int v, Res = 1 << (nVars-1);
    for ( v = 0; v < nVars-1; v++ )
        if ( !Abc_TtVarsAreSymmetric(pTruth, nVars, v, v+1, pCof0, pCof1) )
            Res |= (1 << v);
    return Res;
}